

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O1

NumericValue
Rml::InterpolateNumericValue
          (NumericValue v0,NumericValue v1,float alpha,Element *element,
          PropertyDefinition *definition)

{
  RelativeTarget RVar1;
  ulong uVar2;
  ElementStyle *pEVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  undefined4 local_30;
  
  uVar4 = (ulong)v0 >> 0x20;
  uVar2 = (ulong)v1 >> 0x20;
  if (uVar4 == uVar2) {
    fVar6 = v1.number * alpha + (1.0 - alpha) * v0.number;
  }
  else {
    if (((uVar4 & 0x3fbf0) == 0) ||
       (definition == (PropertyDefinition *)0x0 || (uVar2 & 0x3fbf0) == 0)) {
      if ((uVar2 & 0x3fbc0) == 0 || (uVar4 & 0x3fbc0) == 0) {
        if ((uVar2 & 0xc0000) == 0 || (uVar4 & 0xc0000) == 0) {
          if (alpha < 0.5) {
            v1 = v0;
          }
          fVar6 = v1.number;
          uVar4 = (ulong)v1 >> 0x20;
        }
        else {
          fVar6 = ComputeAngle(v0);
          fVar5 = ComputeAngle(v1);
          fVar6 = (1.0 - alpha) * fVar6 + fVar5 * alpha;
          uVar4 = 0x80000;
        }
        goto LAB_00224c28;
      }
      local_30 = Element::ResolveLength(element,v0);
      fVar6 = Element::ResolveLength(element,v0);
    }
    else {
      pEVar3 = Element::GetStyle(element);
      RVar1 = PropertyDefinition::GetRelativeTarget(definition);
      local_30 = ElementStyle::ResolveRelativeLength(pEVar3,v0,RVar1);
      pEVar3 = Element::GetStyle(element);
      RVar1 = PropertyDefinition::GetRelativeTarget(definition);
      fVar6 = ElementStyle::ResolveRelativeLength(pEVar3,v1,RVar1);
    }
    fVar6 = (1.0 - alpha) * local_30 + fVar6 * alpha;
    uVar4 = 0x40;
  }
LAB_00224c28:
  return (NumericValue)((ulong)(uint)fVar6 | uVar4 << 0x20);
}

Assistant:

static NumericValue InterpolateNumericValue(NumericValue v0, NumericValue v1, float alpha, Element& element, const PropertyDefinition* definition)
{
	// If we have the same units, we can simply interpolate regardless of what the value represents.
	if (v0.unit == v1.unit)
		return NumericValue{Mix(v0.number, v1.number, alpha), v0.unit};

	// When mixing lengths or relative sizes, resolve them to pixel lengths and interpolate. This only works if we have a definition.
	if (Any(v0.unit & Unit::NUMBER_LENGTH_PERCENT) && Any(v1.unit & Unit::NUMBER_LENGTH_PERCENT) && definition)
	{
		float f0 = element.GetStyle()->ResolveRelativeLength(v0, definition->GetRelativeTarget());
		float f1 = element.GetStyle()->ResolveRelativeLength(v1, definition->GetRelativeTarget());
		return NumericValue{Mix(f0, f1, alpha), Unit::PX};
	}

	// As long as we don't mix lengths and percentages, we can still resolve lengths without a definition.
	if (Any(v0.unit & Unit::LENGTH) && Any(v1.unit & Unit::LENGTH))
	{
		float f0 = element.ResolveLength(v0);
		float f1 = element.ResolveLength(v0);
		return NumericValue{Mix(f0, f1, alpha), Unit::PX};
	}

	if (Any(v0.unit & Unit::ANGLE) && Any(v1.unit & Unit::ANGLE))
	{
		float f = Mix(ComputeAngle(v0), ComputeAngle(v1), alpha);
		return NumericValue{f, Unit::RAD};
	}

	// Fall back to discrete interpolation for incompatible units.
	return alpha < 0.5f ? v0 : v1;
}